

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>> *this,
          FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_> *field,ParsingContext *context,
          TagSet<Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *cursor;
  long lVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  cursor = context->cursor;
  lVar1 = *(long *)&cursor->buf->field_0x8;
  pcVar2 = *(char **)&cursor->buf->field_0x10;
  bVar5 = match_until_fast('|',cursor);
  if (bVar5) {
    lVar3 = *(long *)&cursor->buf->field_0x10;
    lVar4 = *(long *)&cursor->buf->field_0x8;
    (field->m_view).first = pcVar2;
    (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar2 + lVar4);
    return;
  }
  ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x1ae);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }